

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

size_t __thiscall common::SettingsSpan::negated(SettingsSpan *this)

{
  long lVar1;
  bool bVar2;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  pointer local_20;
  pointer local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (in_RDI->val)._M_dataplus._M_p;
  do {
    if (local_20 == (pointer)0x0) {
      local_10 = (pointer)0x0;
LAB_0015e3a0:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return (size_t)local_10;
      }
      __stack_chk_fail();
    }
    bVar2 = UniValue::isFalse(in_RDI);
    if (bVar2) {
      local_10 = local_20;
      goto LAB_0015e3a0;
    }
    local_20 = local_20 + -1;
  } while( true );
}

Assistant:

size_t SettingsSpan::negated() const
{
    for (size_t i = size; i > 0; --i) {
        if (data[i - 1].isFalse()) return i; // Return number of negated values (position of last false value)
    }
    return 0;
}